

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O1

void __thiscall xmrig::ConfigTransform::finalize(ConfigTransform *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Type this_00;
  Value profile;
  Data local_78;
  Data local_68;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  BaseTransform::finalize(&this->super_BaseTransform,doc);
  if (this->m_threads != 0) {
    local_68.s.str = (Ch *)0x40500000018cea3;
    local_68.n = (Number)0x7;
    local_78.n = (Number)0x1;
    local_78.s.str = (Ch *)0x1f6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_68.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_78.s,(Ch *)doc);
    if (local_78.n.i64 ==
        (Number)((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.length * 0x20 +
                ((ulong)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.s.str & 0xffffffffffff))) {
      local_68.n = (Number)0x0;
      local_68.s.str = (Ch *)0x3000000000000;
      local_78.s.str = (Ch *)0x40500000018a2b0;
      local_78.n.i64 = (Number)0x3;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_78.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s,allocator);
    }
    local_68.n.i64 = (Number)0x0;
    local_68.s.str = (Ch *)0x3000000000000;
    local_40.s = "intensity";
    local_40.length = 9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_68.s,&local_40,this->m_intensity,allocator);
    local_50.s = "threads";
    local_50.length = 7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_68.s,&local_50,this->m_threads,allocator);
    local_78.s.str = (Ch *)0x40500000018a26f;
    local_78.n = (Number)0x8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_68.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_78.s,this->m_affinity,allocator);
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)doc,"cpu");
    local_78.s.str = (Ch *)0x40500000018d384;
    local_78.n.i64 = (Number)0x1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68.s,doc->allocator_);
  }
  if ((this->super_BaseTransform).field_0xd == '\x01') {
    BaseTransform::set<bool>(&this->super_BaseTransform,doc,"opencl","enabled",true);
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::finalize(rapidjson::Document &doc)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    BaseTransform::finalize(doc);

    if (m_threads) {
        doc.AddMember("version", 1, allocator);

        if (!doc.HasMember(kCpu)) {
            doc.AddMember(StringRef(kCpu), Value(kObjectType), allocator);
        }

        Value profile(kObjectType);
        profile.AddMember(StringRef(kIntensity), m_intensity, allocator);
        profile.AddMember(StringRef(kThreads),   m_threads, allocator);
        profile.AddMember(StringRef(kAffinity),  m_affinity, allocator);

        doc[kCpu].AddMember(StringRef(kAsterisk), profile, doc.GetAllocator());
    }

#   ifdef XMRIG_FEATURE_OPENCL
    if (m_opencl) {
        set(doc, kOcl, kEnabled, true);
    }
#   endif
}